

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_WriteLargeCord_Test::TestBody
          (IoTest_WriteLargeCord_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  undefined1 local_108 [8];
  Cord expected;
  Cord cord;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Cord local_90;
  undefined1 local_80 [8];
  CordOutputStream output;
  string_view local_38;
  int local_24;
  undefined1 local_20 [4];
  int i;
  Cord source;
  IoTest_WriteLargeCord_Test *this_local;
  
  source.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)this;
  absl::lts_20250127::Cord::Cord((Cord *)local_20);
  for (local_24 = 0; local_24 < 0x400; local_24 = local_24 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"foo bar");
    absl::lts_20250127::Cord::Append((Cord *)local_20,local_38);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,"existing:");
  absl::lts_20250127::Cord::Cord(&local_90,stack0xffffffffffffff60);
  CordOutputStream::CordOutputStream((CordOutputStream *)local_80,&local_90,0);
  absl::lts_20250127::Cord::~Cord(&local_90);
  local_b1 = CordOutputStream::WriteCord((CordOutputStream *)local_80,(Cord *)local_20);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&cord.contents_.data_.rep_.field_0 + 8),(internal *)local_b0,
               (AssertionResult *)"output.WriteCord(source)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x542,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)(cord.contents_.data_.rep_.field_0.data + 8));
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  CordOutputStream::Consume((CordOutputStream *)((long)&expected.contents_.data_.rep_.field_0 + 8));
  absl::lts_20250127::Cord::Cord((Cord *)local_108,(Cord *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"existing:");
  absl::lts_20250127::Cord::Prepend((Cord *)local_108,stack0xfffffffffffffee8);
  testing::internal::EqHelper::Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_128,"expected","cord",(Cord *)local_108,
             (Cord *)((long)&expected.contents_.data_.rep_.field_0 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x547,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  absl::lts_20250127::Cord::~Cord((Cord *)local_108);
  absl::lts_20250127::Cord::~Cord((Cord *)((long)&expected.contents_.data_.rep_.field_0 + 8));
  CordOutputStream::~CordOutputStream((CordOutputStream *)local_80);
  absl::lts_20250127::Cord::~Cord((Cord *)local_20);
  return;
}

Assistant:

TEST_F(IoTest, WriteLargeCord) {
  absl::Cord source;
  for (int i = 0; i < 1024; i++) {
    source.Append("foo bar");
  }

  CordOutputStream output(absl::Cord("existing:"));
  EXPECT_TRUE(output.WriteCord(source));
  absl::Cord cord = output.Consume();

  absl::Cord expected = source;
  expected.Prepend("existing:");
  EXPECT_EQ(expected, cord);
}